

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_ActivateSession
               (UA_Server *server,UA_SecureChannel *channel,UA_Session *session,
               UA_ActivateSessionRequest *request,UA_ActivateSessionResponse *response)

{
  long lVar1;
  UA_SecureChannel *pUVar2;
  UA_DataType *pUVar3;
  long *plVar4;
  void *__s1;
  size_t __n;
  bool bVar5;
  bool bVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  size_t sVar10;
  UA_Byte **ppUVar11;
  undefined1 local_70 [8];
  timespec ts;
  
  lVar1 = session->validTill;
  clock_gettime(4,(timespec *)local_70);
  if (lVar1 < ts.tv_sec / 100 + (long)local_70 * 10000000) {
    pUVar2 = session->channel;
    uVar9 = 0;
    uVar8 = 0;
    if ((pUVar2 != (UA_SecureChannel *)0x0) && (pUVar2->connection != (UA_Connection *)0x0)) {
      uVar8 = (ulong)(uint)pUVar2->connection->sockfd;
    }
    if (pUVar2 != (UA_SecureChannel *)0x0) {
      uVar9 = (ulong)(pUVar2->securityToken).channelId;
    }
    ts.tv_nsec = (__syscall_slong_t)(session->sessionId).identifier.guid.data4[0];
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: SecureChannel %i wants to activate, but the session has timed out"
                ,uVar8,uVar9,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,ts.tv_nsec,
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7],
                (ulong)(channel->securityToken).channelId);
    (response->responseHeader).serviceResult = 0x80250000;
    return;
  }
  if (((request->userIdentityToken).encoding < UA_EXTENSIONOBJECT_DECODED) ||
     (pUVar3 = (request->userIdentityToken).content.decoded.type,
     pUVar3 != (UA_DataType *)0x1402b0 && pUVar3 != (UA_DataType *)0x13fc20)) {
    pUVar2 = session->channel;
    uVar9 = 0;
    uVar8 = 0;
    if ((pUVar2 != (UA_SecureChannel *)0x0) && (pUVar2->connection != (UA_Connection *)0x0)) {
      uVar8 = (ulong)(uint)pUVar2->connection->sockfd;
    }
    if (pUVar2 != (UA_SecureChannel *)0x0) {
      uVar9 = (ulong)(pUVar2->securityToken).channelId;
    }
    ts.tv_nsec = (__syscall_slong_t)(session->sessionId).identifier.guid.data4[0];
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: SecureChannel %i wants to activate, but the UserIdentify token is invalid"
                ,uVar8,uVar9,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,ts.tv_nsec,
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7],
                (ulong)(channel->securityToken).channelId);
  }
  else if ((pUVar3 == (UA_DataType *)0x13fc20) && ((server->config).enableAnonymousLogin != false))
  {
    plVar4 = (long *)(request->userIdentityToken).content.decoded.data;
    __s1 = (void *)plVar4[1];
    if ((__s1 == (void *)0x0) ||
       ((*plVar4 == 0x1a && (iVar7 = bcmp(__s1,"open62541-anonymous-policy",0x1a), iVar7 == 0)))) {
LAB_0011e48c:
      pUVar2 = session->channel;
      if (pUVar2 != channel && pUVar2 != (UA_SecureChannel *)0x0) {
        if (pUVar2->connection == (UA_Connection *)0x0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)(uint)pUVar2->connection->sockfd;
        }
        ts.tv_nsec = (__syscall_slong_t)(session->sessionId).identifier.guid.data4[1];
        UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                    "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Detach from old channel"
                    ,uVar8,(ulong)(pUVar2->securityToken).channelId,
                    (ulong)(session->sessionId).identifier.numeric,
                    (ulong)(session->sessionId).identifier.guid.data2,
                    (ulong)(session->sessionId).identifier.guid.data3,
                    (ulong)(session->sessionId).identifier.guid.data4[0],ts.tv_nsec,
                    (ulong)(session->sessionId).identifier.guid.data4[2],
                    (ulong)(session->sessionId).identifier.guid.data4[3],
                    (ulong)(session->sessionId).identifier.guid.data4[4],
                    (ulong)(session->sessionId).identifier.guid.data4[5],
                    (ulong)(session->sessionId).identifier.guid.data4[6],
                    (ulong)(session->sessionId).identifier.guid.data4[7]);
        UA_SecureChannel_detachSession(session->channel,session);
      }
      UA_SecureChannel_attachSession(channel,session);
      session->activated = true;
      UA_Session_updateLifetime(session);
      pUVar2 = session->channel;
      uVar9 = 0;
      uVar8 = 0;
      if ((pUVar2 != (UA_SecureChannel *)0x0) && (pUVar2->connection != (UA_Connection *)0x0)) {
        uVar8 = (ulong)(uint)pUVar2->connection->sockfd;
      }
      if (pUVar2 != (UA_SecureChannel *)0x0) {
        uVar9 = (ulong)(pUVar2->securityToken).channelId;
      }
      UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                  "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Session activated"
                  ,uVar8,uVar9,(ulong)(session->sessionId).identifier.numeric,
                  (ulong)(session->sessionId).identifier.guid.data2,
                  (ulong)(session->sessionId).identifier.guid.data3,
                  (ulong)(session->sessionId).identifier.guid.data4[0],
                  (ulong)(session->sessionId).identifier.guid.data4[1],
                  (ulong)(session->sessionId).identifier.guid.data4[2],
                  (ulong)(session->sessionId).identifier.guid.data4[3],
                  (ulong)(session->sessionId).identifier.guid.data4[4],
                  (ulong)(session->sessionId).identifier.guid.data4[5],
                  (ulong)(session->sessionId).identifier.guid.data4[6],
                  (ulong)(session->sessionId).identifier.guid.data4[7]);
      return;
    }
  }
  else if (((pUVar3 == (UA_DataType *)0x1402b0 & (server->config).enableUsernamePasswordLogin) == 1)
          && ((((plVar4 = (long *)(request->userIdentityToken).content.decoded.data, *plVar4 == 0x19
                && (iVar7 = bcmp((void *)plVar4[1],"open62541-username-policy",0x19), iVar7 == 0))
               && (plVar4[6] == 0)) && ((__n = plVar4[2], __n != 0 || (plVar4[4] != 0)))))) {
    sVar10 = (server->config).usernamePasswordLoginsSize;
    if (sVar10 != 0) {
      ppUVar11 = &(((server->config).usernamePasswordLogins)->password).data;
      bVar6 = false;
      do {
        sVar10 = sVar10 - 1;
        if ((((UA_Byte *)__n == ppUVar11[-3]) &&
            (iVar7 = bcmp((void *)plVar4[3],ppUVar11[-2],__n), iVar7 == 0)) &&
           ((plVar4[4] == ((UA_String *)(ppUVar11 + -1))->length &&
            (iVar7 = bcmp((void *)plVar4[5],*ppUVar11,plVar4[4]), iVar7 == 0)))) {
          bVar6 = true;
          bVar5 = true;
        }
        else {
          bVar5 = false;
        }
      } while ((!bVar5) && (ppUVar11 = ppUVar11 + 4, sVar10 != 0));
      if (bVar6) goto LAB_0011e48c;
    }
    pUVar2 = session->channel;
    uVar9 = 0;
    uVar8 = 0;
    if ((pUVar2 != (UA_SecureChannel *)0x0) && (pUVar2->connection != (UA_Connection *)0x0)) {
      uVar8 = (ulong)(uint)pUVar2->connection->sockfd;
    }
    if (pUVar2 != (UA_SecureChannel *)0x0) {
      uVar9 = (ulong)(pUVar2->securityToken).channelId;
    }
    UA_LOG_INFO((server->config).logger,UA_LOGCATEGORY_SESSION,
                "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x | ActivateSession: Did not find matching username/password"
                ,uVar8,uVar9,(ulong)(session->sessionId).identifier.numeric,
                (ulong)(session->sessionId).identifier.guid.data2,
                (ulong)(session->sessionId).identifier.guid.data3,
                (ulong)(session->sessionId).identifier.guid.data4[0],
                (ulong)(session->sessionId).identifier.guid.data4[1],
                (ulong)(session->sessionId).identifier.guid.data4[2],
                (ulong)(session->sessionId).identifier.guid.data4[3],
                (ulong)(session->sessionId).identifier.guid.data4[4],
                (ulong)(session->sessionId).identifier.guid.data4[5],
                (ulong)(session->sessionId).identifier.guid.data4[6],
                (ulong)(session->sessionId).identifier.guid.data4[7]);
    (response->responseHeader).serviceResult = 0x801f0000;
    return;
  }
  (response->responseHeader).serviceResult = 0x80200000;
  return;
}

Assistant:

void
Service_ActivateSession(UA_Server *server, UA_SecureChannel *channel,
                        UA_Session *session, const UA_ActivateSessionRequest *request,
                        UA_ActivateSessionResponse *response) {
    if(session->validTill < UA_DateTime_nowMonotonic()) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: SecureChannel %i wants "
                            "to activate, but the session has timed out", channel->securityToken.channelId);
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSESSIONIDINVALID;
        return;
    }

    if(request->userIdentityToken.encoding < UA_EXTENSIONOBJECT_DECODED ||
       (request->userIdentityToken.content.decoded.type != &UA_TYPES[UA_TYPES_ANONYMOUSIDENTITYTOKEN] &&
        request->userIdentityToken.content.decoded.type != &UA_TYPES[UA_TYPES_USERNAMEIDENTITYTOKEN])) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: SecureChannel %i wants "
                            "to activate, but the UserIdentify token is invalid", channel->securityToken.channelId);
        response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
        return;
    }


    UA_String ap = UA_STRING(ANONYMOUS_POLICY);
    UA_String up = UA_STRING(USERNAME_POLICY);

    /* Compatibility notice: Siemens OPC Scout v10 provides an empty policyId,
       this is not okay For compatibility we will assume that empty policyId == ANONYMOUS_POLICY
       if(token.policyId->data == NULL)
           response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
    */

    if(server->config.enableAnonymousLogin &&
       request->userIdentityToken.content.decoded.type == &UA_TYPES[UA_TYPES_ANONYMOUSIDENTITYTOKEN]) {
        /* anonymous login */
        const UA_AnonymousIdentityToken *token = request->userIdentityToken.content.decoded.data;
        if(token->policyId.data && !UA_String_equal(&token->policyId, &ap)) {
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }
    } else if(server->config.enableUsernamePasswordLogin &&
              request->userIdentityToken.content.decoded.type == &UA_TYPES[UA_TYPES_USERNAMEIDENTITYTOKEN]) {
        /* username login */
        const UA_UserNameIdentityToken *token = request->userIdentityToken.content.decoded.data;
        if(!UA_String_equal(&token->policyId, &up)) {
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }
        if(token->encryptionAlgorithm.length > 0) {
            /* we don't support encryption */
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }

        if(token->userName.length == 0 && token->password.length == 0) {
            /* empty username and password */
            response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
            return;
        }

        /* trying to match pw/username */
        UA_Boolean match = false;
        for(size_t i = 0; i < server->config.usernamePasswordLoginsSize; ++i) {
            UA_String *user = &server->config.usernamePasswordLogins[i].username;
            UA_String *pw = &server->config.usernamePasswordLogins[i].password;
            if(UA_String_equal(&token->userName, user) && UA_String_equal(&token->password, pw)) {
                match = true;
                break;
            }
        }
        if(!match) {
            UA_LOG_INFO_SESSION(server->config.logger, session,
                                "ActivateSession: Did not find matching username/password");
            response->responseHeader.serviceResult = UA_STATUSCODE_BADUSERACCESSDENIED;
            return;
        }
    } else {
        /* Unsupported token type */
        response->responseHeader.serviceResult = UA_STATUSCODE_BADIDENTITYTOKENINVALID;
        return;
    }

    /* Detach the old SecureChannel */
    if(session->channel && session->channel != channel) {
        UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: Detach from old channel");
        UA_SecureChannel_detachSession(session->channel, session);
    }

    /* Attach to the SecureChannel and activate */
    UA_SecureChannel_attachSession(channel, session);
    session->activated = true;
    UA_Session_updateLifetime(session);
    UA_LOG_INFO_SESSION(server->config.logger, session, "ActivateSession: Session activated");
}